

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall
summarycalc::processsummarysets
          (summarycalc *this,int coverage_or_output_id,int sidx,OASIS_FLOAT gul)

{
  int *piVar1;
  
  for (piVar1 = (this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar1 != (this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar1 = piVar1 + 1) {
    processsummaryset(this,*piVar1,coverage_or_output_id,sidx,gul);
  }
  return;
}

Assistant:

inline void summarycalc::processsummarysets(const int coverage_or_output_id,
					    const int sidx,
					    const OASIS_FLOAT gul)
{
	for (auto it = foutIndex_.begin(); it != foutIndex_.end(); ++it) {
		processsummaryset(*it, coverage_or_output_id, sidx, gul);
	}
}